

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::detail::getTlsOssResult(void)

{
  size_t sVar1;
  String *in_RDI;
  char *local_30;
  char local_20 [16];
  
  g_infoContexts::__tls_init();
  std::__cxx11::stringbuf::str();
  sVar1 = strlen(local_30);
  String::String(in_RDI,local_30,(uint)sVar1);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return in_RDI;
}

Assistant:

String getTlsOssResult() {
        //g_oss << std::ends; // needed - as shown here: https://stackoverflow.com/a/624291/3162383
        return g_oss.str().c_str();
    }